

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O2

void __thiscall
cmDependsC::cmDependsC
          (cmDependsC *this,cmLocalUnixMakefileGenerator3 *lg,string *targetDir,string *lang,
          DependencyMap *validDeps)

{
  _Rb_tree_header *p_Var1;
  cmMakefile *this_00;
  cmValue cVar2;
  string scanRegexVar;
  string complainRegex;
  string scanRegex;
  string complainRegexVar;
  string local_138;
  queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  *local_118;
  char *local_110;
  size_t local_108;
  char *local_f0;
  size_t local_e8;
  cmAlphaNum local_d0;
  string local_a0;
  cmAlphaNum local_80;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)targetDir);
  cmDepends::cmDepends(&this->super_cmDepends,lg,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsC_007a8060;
  (this->IncludeRegexLine).regmust = (char *)0x0;
  (this->IncludeRegexLine).program = (char *)0x0;
  (this->IncludeRegexLine).progsize = 0;
  memset(&this->IncludeRegexLine,0,0xaa);
  (this->IncludeRegexScan).regmust = (char *)0x0;
  (this->IncludeRegexScan).program = (char *)0x0;
  (this->IncludeRegexScan).progsize = 0;
  memset(&this->IncludeRegexScan,0,0xaa);
  (this->IncludeRegexComplain).regmust = (char *)0x0;
  (this->IncludeRegexComplain).program = (char *)0x0;
  (this->IncludeRegexComplain).progsize = 0;
  memset(&this->IncludeRegexComplain,0,0xaa);
  (this->IncludeRegexLineString)._M_dataplus._M_p = (pointer)&(this->IncludeRegexLineString).field_2
  ;
  (this->IncludeRegexLineString)._M_string_length = 0;
  (this->IncludeRegexLineString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexScanString)._M_dataplus._M_p = (pointer)&(this->IncludeRegexScanString).field_2
  ;
  (this->IncludeRegexScanString)._M_string_length = 0;
  (this->IncludeRegexScanString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexComplainString)._M_dataplus._M_p =
       (pointer)&(this->IncludeRegexComplainString).field_2;
  (this->IncludeRegexComplainString)._M_string_length = 0;
  (this->IncludeRegexComplainString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexTransformString)._M_dataplus._M_p =
       (pointer)&(this->IncludeRegexTransformString).field_2;
  (this->IncludeRegexTransformString)._M_string_length = 0;
  (this->IncludeRegexTransformString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexTransform).regmust = (char *)0x0;
  (this->IncludeRegexTransform).program = (char *)0x0;
  (this->IncludeRegexTransform).progsize = 0;
  memset(&this->IncludeRegexTransform,0,0xaa);
  p_Var1 = &(this->TransformRules)._M_t._M_impl.super__Rb_tree_header;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->ValidDeps = validDeps;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->Encountered)._M_t._M_impl.super__Rb_tree_header;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118 = &this->Unscanned;
  std::
  queue<cmDependsC::UnscannedEntry,std::deque<cmDependsC::UnscannedEntry,std::allocator<cmDependsC::UnscannedEntry>>>
  ::queue<std::deque<cmDependsC::UnscannedEntry,std::allocator<cmDependsC::UnscannedEntry>>,void>
            (local_118);
  p_Var1 = &(this->FileCache)._M_t._M_impl.super__Rb_tree_header;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->CacheFileName)._M_dataplus._M_p = (pointer)&(this->CacheFileName).field_2;
  (this->CacheFileName)._M_string_length = 0;
  (this->CacheFileName).field_2._M_local_buf[0] = '\0';
  this_00 = (lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  cmDepends::SetIncludePathFromLanguage(&this->super_cmDepends,lang);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"^.*$",(allocator<char> *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"^$",(allocator<char> *)&local_d0);
  local_d0.View_._M_len = 6;
  local_d0.View_._M_str = "CMAKE_";
  local_80.View_._M_str = (lang->_M_dataplus)._M_p;
  local_80.View_._M_len = lang->_M_string_length;
  cmStrCat<char[20]>(&local_138,&local_d0,&local_80,(char (*) [20])"_INCLUDE_REGEX_SCAN");
  cVar2 = cmMakefile::GetDefinition(this_00,&local_138);
  if (cVar2.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_f0);
  }
  local_d0.View_._M_len = 6;
  local_d0.View_._M_str = "CMAKE_";
  local_80.View_._M_str = (lang->_M_dataplus)._M_p;
  local_80.View_._M_len = lang->_M_string_length;
  cmStrCat<char[24]>(&local_a0,&local_d0,&local_80,(char (*) [24])"_INCLUDE_REGEX_COMPLAIN");
  cVar2 = cmMakefile::GetDefinition(this_00,&local_a0);
  if (cVar2.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_110);
  }
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_138);
  cmsys::RegularExpression::compile
            (&this->IncludeRegexLine,"^[ \t]*[#%][ \t]*(include|import)[ \t]*[<\"]([^\">]+)([\">])")
  ;
  cmsys::RegularExpression::compile(&this->IncludeRegexScan,local_f0);
  cmsys::RegularExpression::compile(&this->IncludeRegexComplain,local_110);
  std::__cxx11::string::assign((char *)&this->IncludeRegexLineString);
  local_d0.View_._M_len = 0x13;
  local_d0.View_._M_str = "#IncludeRegexScan: ";
  local_80.View_._M_len = local_e8;
  local_80.View_._M_str = local_f0;
  cmStrCat<>(&local_138,&local_d0,&local_80);
  std::__cxx11::string::operator=((string *)&this->IncludeRegexScanString,(string *)&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  local_d0.View_._M_len = 0x17;
  local_d0.View_._M_str = "#IncludeRegexComplain: ";
  local_80.View_._M_len = local_108;
  local_80.View_._M_str = local_110;
  cmStrCat<>(&local_138,&local_d0,&local_80);
  std::__cxx11::string::operator=((string *)&this->IncludeRegexComplainString,(string *)&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  SetupTransforms(this);
  local_d0.View_._M_str = (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
  local_d0.View_._M_len = (this->super_cmDepends).TargetDirectory._M_string_length;
  local_80.View_._M_str = local_80.Digits_;
  local_80.View_._M_len = 1;
  local_80.Digits_[0] = '/';
  cmStrCat<std::__cxx11::string,char[14]>
            (&local_138,&local_d0,&local_80,lang,(char (*) [14])".includecache");
  std::__cxx11::string::operator=((string *)&this->CacheFileName,(string *)&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  ReadCacheFile(this);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  return;
}

Assistant:

cmDependsC::cmDependsC(cmLocalUnixMakefileGenerator3* lg,
                       const std::string& targetDir, const std::string& lang,
                       const DependencyMap* validDeps)
  : cmDepends(lg, targetDir)
  , ValidDeps(validDeps)
{
  cmMakefile* mf = lg->GetMakefile();

  // Configure the include file search path.
  this->SetIncludePathFromLanguage(lang);

  // Configure regular expressions.
  std::string scanRegex = "^.*$";
  std::string complainRegex = "^$";
  {
    std::string scanRegexVar = cmStrCat("CMAKE_", lang, "_INCLUDE_REGEX_SCAN");
    if (cmValue sr = mf->GetDefinition(scanRegexVar)) {
      scanRegex = *sr;
    }
    std::string complainRegexVar =
      cmStrCat("CMAKE_", lang, "_INCLUDE_REGEX_COMPLAIN");
    if (cmValue cr = mf->GetDefinition(complainRegexVar)) {
      complainRegex = *cr;
    }
  }

  this->IncludeRegexLine.compile(INCLUDE_REGEX_LINE);
  this->IncludeRegexScan.compile(scanRegex);
  this->IncludeRegexComplain.compile(complainRegex);
  this->IncludeRegexLineString = INCLUDE_REGEX_LINE_MARKER INCLUDE_REGEX_LINE;
  this->IncludeRegexScanString =
    cmStrCat(INCLUDE_REGEX_SCAN_MARKER, scanRegex);
  this->IncludeRegexComplainString =
    cmStrCat(INCLUDE_REGEX_COMPLAIN_MARKER, complainRegex);

  this->SetupTransforms();

  this->CacheFileName =
    cmStrCat(this->TargetDirectory, '/', lang, ".includecache");

  this->ReadCacheFile();
}